

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

void sysbvm_interpreter_evaluateArgumentNodeInEnvironment
               (sysbvm_context_t *context,size_t argumentNodeIndex,sysbvm_tuple_t argumentNode,
               sysbvm_tuple_t *activationEnvironment,sysbvm_tuple_t *argumentValue)

{
  sysbvm_tuple_t type_;
  undefined1 local_80 [8];
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_24_3_c95f86a5 gcFrame;
  sysbvm_tuple_t *argumentValue_local;
  sysbvm_tuple_t *activationEnvironment_local;
  sysbvm_tuple_t argumentNode_local;
  size_t argumentNodeIndex_local;
  sysbvm_context_t *context_local;
  
  gcFrame.expectedType = *argumentValue;
  gcFrameRecord.roots = (sysbvm_tuple_t *)argumentNode;
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  local_80 = (undefined1  [8])0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = gcFrameRecord.roots[2];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_80);
  if ((gcFrameRecord.roots[7] != 0) &&
     (type_ = sysbvm_interpreter_evaluateASTWithEnvironment
                        (context,gcFrameRecord.roots[7],*activationEnvironment), type_ != 0)) {
    gcFrame.expectedType = sysbvm_type_coerceValue(context,type_,gcFrame.expectedType);
  }
  sysbvm_interpreter_bindArgumentNodeValueInEnvironment
            (context,argumentNodeIndex,activationEnvironment,gcFrame.expectedType);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_80);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return;
}

Assistant:

static void sysbvm_interpreter_evaluateArgumentNodeInEnvironment(sysbvm_context_t *context, size_t argumentNodeIndex, sysbvm_tuple_t argumentNode, sysbvm_tuple_t *activationEnvironment, sysbvm_tuple_t *argumentValue)
{
    struct {
        sysbvm_astArgumentNode_t *argumentNode;
        sysbvm_tuple_t expectedType;
        sysbvm_tuple_t value;
    } gcFrame = {
        .argumentNode = (sysbvm_astArgumentNode_t*)argumentNode,
        .value = *argumentValue
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.argumentNode->super.sourcePosition);

    if(gcFrame.argumentNode->type)
    {
        gcFrame.expectedType = sysbvm_interpreter_evaluateASTWithEnvironment(context, gcFrame.argumentNode->type, *activationEnvironment);
        if(gcFrame.expectedType)
            gcFrame.value = sysbvm_type_coerceValue(context, gcFrame.expectedType, gcFrame.value);
    }

    sysbvm_interpreter_bindArgumentNodeValueInEnvironment(context, argumentNodeIndex, activationEnvironment, gcFrame.value);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
}